

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_227ed00::PeerManagerImpl::GetNodeStateStats
          (PeerManagerImpl *this,NodeId nodeid,CNodeStateStats *stats)

{
  bool bVar1;
  long lVar2;
  HeadersSyncState *pHVar3;
  int iVar4;
  CNodeState *pCVar5;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar6;
  TxRelay *mutexIn;
  __int_type_conflict3 _Var7;
  int iVar8;
  _List_node_base *p_Var9;
  rep rVar10;
  long in_FS_OFFSET;
  bool bVar11;
  PeerRef peer;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock33,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
             ,0x751,false);
  pCVar5 = State(this,nodeid);
  if (pCVar5 == (CNodeState *)0x0) {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock33.super_unique_lock);
    bVar11 = false;
  }
  else {
    iVar4 = -1;
    iVar8 = iVar4;
    if (pCVar5->pindexBestKnownBlock != (CBlockIndex *)0x0) {
      iVar8 = pCVar5->pindexBestKnownBlock->nHeight;
    }
    stats->nSyncHeight = iVar8;
    if (pCVar5->pindexLastCommonBlock != (CBlockIndex *)0x0) {
      iVar4 = pCVar5->pindexLastCommonBlock->nHeight;
    }
    stats->nCommonHeight = iVar4;
    p_Var9 = (_List_node_base *)&pCVar5->vBlocksInFlight;
    while (p_Var9 = (((_List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                       *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var9 != (_List_node_base *)&pCVar5->vBlocksInFlight) {
      if (p_Var9[1]._M_next != (_List_node_base *)0x0) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&stats->vHeightInFlight,(value_type_conflict2 *)((long)p_Var9[1]._M_next + 0x18))
        ;
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock33.super_unique_lock);
    GetPeerRef((PeerManagerImpl *)&peer,(NodeId)this);
    bVar11 = peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             != (element_type *)0x0;
    if (bVar11) {
      stats->their_services =
           ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->m_their_services)._M_i;
      stats->m_starting_height =
           ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->m_starting_height).super___atomic_base<int>._M_i;
      if ((((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->m_ping_nonce_sent).super___atomic_base<unsigned_long>._M_i == 0) ||
         (((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->m_ping_start)._M_i.__r == 0)) {
        rVar10 = 0;
      }
      else {
        tVar6 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                          ();
        rVar10 = (long)tVar6.__d.__r -
                 ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_ping_start)._M_i.__r;
      }
      mutexIn = Peer::GetTxRelay(peer.
                                 super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
      if (mutexIn == (TxRelay *)0x0) {
        stats->m_relay_txs = false;
        _Var7 = 0;
      }
      else {
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  (&criticalblock33,&mutexIn->m_bloom_filter_mutex,"tx_relay->m_bloom_filter_mutex",
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                   ,0x76d,false);
        bVar1 = mutexIn->m_relay_txs;
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock33.super_unique_lock);
        stats->m_relay_txs = bVar1;
        _Var7 = (mutexIn->m_fee_filter_received).super___atomic_base<long>._M_i;
      }
      stats->m_fee_filter_received = _Var7;
      (stats->m_ping_wait).__r = rVar10;
      stats->m_addr_processed =
           ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->m_addr_processed).super___atomic_base<unsigned_long>._M_i;
      stats->m_addr_rate_limited =
           ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->m_addr_rate_limited).super___atomic_base<unsigned_long>._M_i;
      stats->m_addr_relay_enabled =
           (bool)(((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->m_addr_relay_enabled)._M_base._M_i & 1);
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&criticalblock33,
                 &(peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_headers_sync_mutex,"peer->m_headers_sync_mutex",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                 ,0x779,false);
      pHVar3 = ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_headers_sync)._M_t.
               super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>._M_t.
               super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
               super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl;
      if (pHVar3 != (HeadersSyncState *)0x0) {
        stats->presync_height = pHVar3->m_current_height;
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&criticalblock33);
      (stats->time_offset).__r =
           ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->m_time_offset)._M_i.__r;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar11;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::GetNodeStateStats(NodeId nodeid, CNodeStateStats& stats) const
{
    {
        LOCK(cs_main);
        const CNodeState* state = State(nodeid);
        if (state == nullptr)
            return false;
        stats.nSyncHeight = state->pindexBestKnownBlock ? state->pindexBestKnownBlock->nHeight : -1;
        stats.nCommonHeight = state->pindexLastCommonBlock ? state->pindexLastCommonBlock->nHeight : -1;
        for (const QueuedBlock& queue : state->vBlocksInFlight) {
            if (queue.pindex)
                stats.vHeightInFlight.push_back(queue.pindex->nHeight);
        }
    }

    PeerRef peer = GetPeerRef(nodeid);
    if (peer == nullptr) return false;
    stats.their_services = peer->m_their_services;
    stats.m_starting_height = peer->m_starting_height;
    // It is common for nodes with good ping times to suddenly become lagged,
    // due to a new block arriving or other large transfer.
    // Merely reporting pingtime might fool the caller into thinking the node was still responsive,
    // since pingtime does not update until the ping is complete, which might take a while.
    // So, if a ping is taking an unusually long time in flight,
    // the caller can immediately detect that this is happening.
    auto ping_wait{0us};
    if ((0 != peer->m_ping_nonce_sent) && (0 != peer->m_ping_start.load().count())) {
        ping_wait = GetTime<std::chrono::microseconds>() - peer->m_ping_start.load();
    }

    if (auto tx_relay = peer->GetTxRelay(); tx_relay != nullptr) {
        stats.m_relay_txs = WITH_LOCK(tx_relay->m_bloom_filter_mutex, return tx_relay->m_relay_txs);
        stats.m_fee_filter_received = tx_relay->m_fee_filter_received.load();
    } else {
        stats.m_relay_txs = false;
        stats.m_fee_filter_received = 0;
    }

    stats.m_ping_wait = ping_wait;
    stats.m_addr_processed = peer->m_addr_processed.load();
    stats.m_addr_rate_limited = peer->m_addr_rate_limited.load();
    stats.m_addr_relay_enabled = peer->m_addr_relay_enabled.load();
    {
        LOCK(peer->m_headers_sync_mutex);
        if (peer->m_headers_sync) {
            stats.presync_height = peer->m_headers_sync->GetPresyncHeight();
        }
    }
    stats.time_offset = peer->m_time_offset;

    return true;
}